

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void opidx_dir_rel_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  undefined4 *puVar2;
  m680x_info *in_RDX;
  MCInst *in_RSI;
  long in_RDI;
  cs_m680x_op *op;
  cs_m680x *m680x;
  uchar *address_00;
  
  address_00 = &in_RSI->Operands[0].Kind;
  bVar1 = in_RSI->Operands[0].field_0x5;
  in_RSI->Operands[0].field_0x5 = bVar1 + 1;
  puVar2 = (undefined4 *)((long)in_RSI->Operands + (ulong)bVar1 * 0x18 + 8);
  *puVar2 = 7;
  *(char *)(puVar2 + 1) = (char)((*(uint *)(in_RDI + 8) & 0xe) >> 1);
  direct_hdlr(in_RSI,in_RDX,(uint16_t *)address_00);
  relative8_hdlr(in_RSI,in_RDX,(uint16_t *)address_00);
  add_reg_to_rw_list(in_RSI,(m680x_reg)((ulong)in_RDX >> 0x20),(e_access)in_RDX);
  return;
}

Assistant:

static void opidx_dir_rel_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op = &m680x->operands[m680x->op_count++];

	// bit index is coded in Opcode
	op->type = M680X_OP_CONSTANT;
	op->const_val = (MI->Opcode & 0x0e) >> 1;
	direct_hdlr(MI, info, address);
	relative8_hdlr(MI, info, address);

	add_reg_to_rw_list(MI, M680X_REG_CC, MODIFY);
}